

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

void __thiscall
capnp::_::ReaderArena::ReaderArena
          (ReaderArena *this,MessageReader *message,word *firstSegment,
          SegmentWordCount firstSegmentSize)

{
  (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__ReaderArena_00277ec8;
  this->message = message;
  (this->readLimiter).limit = (message->options).traversalLimitInWords;
  (this->segment0).arena = &this->super_Arena;
  (this->segment0).id.value = 0;
  (this->segment0).ptr.ptr = firstSegment;
  (this->segment0).ptr.size_ = (ulong)firstSegmentSize;
  (this->segment0).readLimiter = &this->readLimiter;
  kj::
  MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
  ::MutexGuarded<>(&this->moreSegments);
  return;
}

Assistant:

inline ReaderArena::ReaderArena(MessageReader* message, const word* firstSegment,
                                SegmentWordCount firstSegmentSize)
    : message(message),
      readLimiter(bounded(message->getOptions().traversalLimitInWords) * WORDS),
      segment0(this, SegmentId(0), firstSegment, firstSegmentSize, &readLimiter) {}